

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

optional<pbrt::CameraRay> * __thiscall
pbrt::RealisticCamera::GenerateRay
          (RealisticCamera *this,CameraSample sample,SampledWavelengths *lambda)

{
  Float *in_RSI;
  optional<pbrt::CameraRay> *in_RDI;
  float fVar1;
  Float v;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  Point3f PVar8;
  Vector3<float> VVar9;
  undefined4 in_stack_00000008;
  Float cosTheta;
  Float weight;
  Ray ray;
  Ray rFilm;
  Point3f pRear;
  Float exitPupilBoundsArea;
  Point3f pFilm;
  Point2f pFilm2;
  Point2f s;
  MediumHandle *in_stack_fffffffffffffe08;
  CameraRay *v_00;
  CameraBase *in_stack_fffffffffffffe10;
  optional<pbrt::CameraRay> *this_00;
  undefined4 in_stack_fffffffffffffe18;
  float fVar10;
  Float in_stack_fffffffffffffe1c;
  optional<pbrt::CameraRay> *o;
  undefined4 in_stack_fffffffffffffe30;
  Point2f *in_stack_fffffffffffffe70;
  Point2f *in_stack_fffffffffffffe78;
  RealisticCamera *in_stack_fffffffffffffe80;
  undefined1 local_118 [60];
  undefined8 local_dc;
  float local_d4;
  Float local_d0;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a4;
  float local_9c;
  Ray *in_stack_ffffffffffffff78;
  Ray *in_stack_ffffffffffffff80;
  RealisticCamera *in_stack_ffffffffffffff88;
  float local_48;
  undefined1 extraout_var [56];
  undefined1 auVar7 [56];
  
  o = in_RDI;
  FilmHandle::FullResolution((FilmHandle *)in_stack_fffffffffffffe08);
  FilmHandle::FullResolution((FilmHandle *)in_stack_fffffffffffffe08);
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffe10,
             (float)((ulong)in_stack_fffffffffffffe08 >> 0x20),SUB84(in_stack_fffffffffffffe08,0));
  auVar2._0_8_ = Bounds2<float>::Lerp
                           ((Bounds2<float> *)
                            CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                            (Point2f *)in_stack_fffffffffffffe10);
  auVar2._8_56_ = extraout_var;
  vmovlpd_avx(auVar2._0_16_);
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffffe10,
             (float)((ulong)in_stack_fffffffffffffe08 >> 0x20),SUB84(in_stack_fffffffffffffe08,0),
             0.0);
  auVar7 = (undefined1  [56])0x0;
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffe10,
             (float)((ulong)in_stack_fffffffffffffe08 >> 0x20),SUB84(in_stack_fffffffffffffe08,0));
  PVar8 = SampleExitPupil(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                          in_stack_fffffffffffffe70,in_RSI);
  auVar3._0_8_ = PVar8.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar7;
  vmovlpd_avx(auVar3._0_16_);
  VVar9 = Point3<float>::operator-
                    ((Point3<float> *)in_RDI,
                     (Point3<float> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
  ;
  local_b0 = VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar7;
  local_b8 = vmovlpd_avx(auVar4._0_16_);
  local_a4 = local_b8;
  local_9c = local_b0;
  MediumHandle::TaggedPointer((MediumHandle *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Ray::Ray((Ray *)CONCAT44(in_stack_00000008,in_stack_fffffffffffffe30),(Point3f *)o,
           (Vector3f *)in_RDI,in_stack_fffffffffffffe1c,(MediumHandle *)in_stack_fffffffffffffe10);
  Ray::Ray((Ray *)in_stack_fffffffffffffe10);
  local_118._44_4_ =
       TraceLensesFromFilm(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff78);
  if (((float)local_118._44_4_ != 0.0) || (NAN((float)local_118._44_4_))) {
    local_d0 = CameraBase::SampleTime
                         (in_stack_fffffffffffffe10,
                          (Float)((ulong)in_stack_fffffffffffffe08 >> 0x20));
    auVar7 = extraout_var_00;
    MediumHandle::operator=((MediumHandle *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    this_00 = (optional<pbrt::CameraRay> *)local_118;
    v_00 = (CameraRay *)(local_118 + 0x30);
    CameraBase::RenderFromCamera
              ((CameraBase *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
               (Ray *)this_00);
    Ray::operator=((Ray *)this_00,&v_00->ray);
    VVar9 = Normalize<float>((Vector3<float> *)CONCAT44(in_stack_00000008,in_stack_fffffffffffffe30)
                            );
    local_d4 = VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar5._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar7;
    local_dc = vmovlpd_avx(auVar5._0_16_);
    VVar9 = Normalize<float>((Vector3<float> *)CONCAT44(in_stack_00000008,in_stack_fffffffffffffe30)
                            );
    auVar6._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar7;
    vmovlpd_avx(auVar6._0_16_);
    fVar10 = in_RSI[0xcf] - in_RSI[0xce];
    fVar1 = Pow<4>((float)((ulong)this_00 >> 0x20));
    fVar10 = fVar10 * fVar1 * local_48;
    v = LensRearZ((RealisticCamera *)0x6bb6ac);
    fVar1 = Sqr<float>(v);
    local_118._44_4_ = (fVar10 / fVar1) * (float)local_118._44_4_;
    Ray::Ray((Ray *)this_00,&v_00->ray);
    SampledSpectrum::SampledSpectrum((SampledSpectrum *)this_00,(Float)((ulong)v_00 >> 0x20));
    pstd::optional<pbrt::CameraRay>::optional(this_00,v_00);
  }
  else {
    memset(in_RDI,0,0x40);
    pstd::optional<pbrt::CameraRay>::optional(in_RDI);
  }
  return o;
}

Assistant:

pstd::optional<CameraRay> RealisticCamera::GenerateRay(CameraSample sample,
                                                       SampledWavelengths &lambda) const {
    // Find point on film, _pFilm_, corresponding to _sample.pFilm_
    Point2f s(sample.pFilm.x / film.FullResolution().x,
              sample.pFilm.y / film.FullResolution().y);
    Point2f pFilm2 = physicalExtent.Lerp(s);
    Point3f pFilm(-pFilm2.x, pFilm2.y, 0);

    // Trace ray from _pFilm_ through lens system
    Float exitPupilBoundsArea;
    Point3f pRear =
        SampleExitPupil(Point2f(pFilm.x, pFilm.y), sample.pLens, &exitPupilBoundsArea);
    Ray rFilm(pFilm, pRear - pFilm);
    Ray ray;
    Float weight = TraceLensesFromFilm(rFilm, &ray);
    if (weight == 0)
        return {};

    // Finish initialization of _RealisticCamera_ ray
    ray.time = SampleTime(sample.time);
    ray.medium = medium;
    ray = RenderFromCamera(ray);
    ray.d = Normalize(ray.d);

    // Compute weighting for _RealisticCamera_ ray
    Float cosTheta = Normalize(rFilm.d).z;
    weight *= (shutterClose - shutterOpen) * Pow<4>(cosTheta) * exitPupilBoundsArea /
              Sqr(LensRearZ());

    return CameraRay{ray, SampledSpectrum(weight)};
}